

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

aiVector3D __thiscall Assimp::XGLImporter::ReadVec3(XGLImporter *this)

{
  Assimp AVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Assimp *this_00;
  Assimp *pAVar4;
  ulong uVar5;
  float *pfVar6;
  int i;
  aiVector3D aVar7;
  float local_40;
  float local_3c;
  undefined8 local_38;
  
  local_38 = 0;
  local_40 = 0.0;
  bVar2 = SkipToText(this);
  if (bVar2) {
    iVar3 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    this_00 = (Assimp *)CONCAT44(extraout_var,iVar3);
    iVar3 = 0;
LAB_005e4e92:
    do {
      uVar5 = (ulong)(byte)*this_00;
      if (uVar5 < 0x21) {
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) != 0) {
          this_00 = this_00 + 1;
          goto LAB_005e4e92;
        }
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005e4f2a;
      }
      local_3c = 0.0;
      pAVar4 = (Assimp *)
               fast_atoreal_move<float>(this_00,(char *)&local_3c,(float *)0x1,(bool)*this_00);
      pfVar6 = &local_40;
      if ((iVar3 != 2) && (pfVar6 = (float *)&local_38, iVar3 == 1)) {
        pfVar6 = (float *)((long)&local_38 + 4);
      }
      *pfVar6 = local_3c;
      do {
        do {
          this_00 = pAVar4 + 1;
          AVar1 = *pAVar4;
          pAVar4 = this_00;
        } while (AVar1 == (Assimp)0x20);
      } while (AVar1 == (Assimp)0x9);
      if ((iVar3 != 2) && (AVar1 != (Assimp)0x2c)) goto LAB_005e4f2a;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
  }
  else {
LAB_005e4f2a:
    LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5e4f32);
  }
  aVar7.z = local_40;
  aVar7.x = (float)(undefined4)local_38;
  aVar7.y = (float)local_38._4_4_;
  return aVar7;
}

Assistant:

aiVector3D XGLImporter::ReadVec3()
{
    aiVector3D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec3 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    for(int i = 0; i < 3; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec3");
            return vec;
        }
        vec[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 2 && *s != ',') {
            LogError("expected comma, failed to parse vec3");
            return vec;
        }
        ++s;
    }

    return vec;
}